

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
::ExportConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
                   *this,int i_con,Container *cnt)

{
  BasicLogger *pBVar1;
  MemoryWriter wrt;
  MemoryWriter local_240;
  
  pBVar1 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
  if (pBVar1 != (BasicLogger *)0x0) {
    local_240.super_BasicWriter<char>.buffer_ = &local_240.buffer_.super_Buffer<char>;
    local_240.super_BasicWriter<char>._vptr_BasicWriter =
         (_func_int **)&PTR__BasicMemoryWriter_003993a0;
    local_240.buffer_.super_Buffer<char>.ptr_ = local_240.buffer_.data_;
    local_240.buffer_.super_Buffer<char>.size_ = 0;
    local_240.buffer_.super_Buffer<char>.capacity_ = 500;
    local_240.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_003993e8;
    WriteCon2JSON(this,&local_240,i_con,cnt);
    fmt::BasicWriter<char>::write<>
              (&local_240.super_BasicWriter<char>,(BasicCStringRef<char>)0x2bd523);
    pBVar1 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar1,&local_240);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_240);
  }
  return;
}

Assistant:

void ExportConstraint(int i_con, const Container& cnt) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      WriteCon2JSON(wrt, i_con, cnt);
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }